

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Option<Catch::GroupInfo> * __thiscall
Catch::Option<Catch::GroupInfo>::operator=(Option<Catch::GroupInfo> *this,GroupInfo *_value)

{
  GroupInfo *pGVar1;
  pointer pcVar2;
  size_t sVar3;
  
  pGVar1 = this->nullableValue;
  if ((pGVar1 != (GroupInfo *)0x0) &&
     (pcVar2 = (pGVar1->name)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar2 != &(pGVar1->name).field_2)) {
    operator_delete(pcVar2);
  }
  this->nullableValue = (GroupInfo *)0x0;
  (this->field_1).dummy2 = (_func_void *)((long)&this->field_1 + 0x10);
  pcVar2 = (_value->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->field_1,pcVar2,pcVar2 + (_value->name)._M_string_length);
  sVar3 = _value->groupsCounts;
  *(size_t *)((long)&this->field_1 + 0x20) = _value->groupIndex;
  *(size_t *)((long)&this->field_1 + 0x28) = sVar3;
  this->nullableValue = (GroupInfo *)&this->field_1;
  return this;
}

Assistant:

Option& operator = ( T const& _value ) {
            reset();
            nullableValue = new( storage ) T( _value );
            return *this;
        }